

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib670.c
# Opt level: O3

int test(char *URL)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int *piVar5;
  time_t tVar6;
  char *pcVar7;
  int still_running;
  ReadThis pooh;
  timeval timeout;
  int msgs_left;
  fd_set fdexcept;
  fd_set fdwrite;
  int local_1e8;
  int local_1e4;
  undefined8 local_1e0;
  long local_1d8;
  undefined4 local_1d0;
  timeval local_1c8;
  fd_set local_1b8;
  fd_set local_138;
  fd_set local_b8;
  
  local_1e4 = 0;
  iVar1 = curl_global_init(3);
  if (iVar1 != 0) {
    curl_mfprintf(_stderr,"curl_global_init() failed\n");
    return 0x7e;
  }
  local_1d8 = 0;
  local_1d0 = 0;
  uVar3 = curl_easy_init();
  uVar4 = 0;
  local_1e0 = uVar3;
  iVar1 = curl_easy_setopt(uVar3,0x2712,URL);
  if (iVar1 != 0) goto LAB_00101396;
  uVar4 = 0;
  iVar1 = curl_easy_setopt(uVar3,0x29,1);
  if (iVar1 != 0) goto LAB_00101396;
  uVar4 = 0;
  iVar1 = curl_easy_setopt(uVar3,0x2a,1);
  if (iVar1 != 0) goto LAB_00101396;
  uVar4 = curl_mime_init(uVar3);
  uVar3 = curl_mime_addpart(uVar4);
  iVar1 = curl_mime_name(uVar3,"field");
  if (iVar1 != 0) {
    curl_mfprintf(_stderr,"Something went wrong when building the mime structure: %d\n",iVar1);
    iVar1 = 0;
    goto LAB_00101396;
  }
  iVar2 = curl_mime_data_cb(uVar3,2,read_callback,0,0,&local_1e0);
  if ((iVar2 == 0) && (iVar1 = curl_easy_setopt(local_1e0,0x281d,uVar4), iVar1 != 0))
  goto LAB_00101396;
  uVar3 = curl_multi_init();
  iVar1 = curl_multi_add_handle(uVar3,local_1e0);
  if (iVar1 == 0) {
    local_1e8 = -1;
    iVar1 = curl_multi_perform(uVar3,&local_1e4);
    if (iVar1 == 0 && local_1e4 != 0) {
      do {
        if (local_1d8 != 0) {
          tVar6 = time((time_t *)0x0);
          if (tVar6 - local_1d8 < 8) {
            if (1 < tVar6 - local_1d8) {
              curl_easy_pause(local_1e0,0);
            }
            goto LAB_0010152a;
          }
          iVar2 = 0x1c;
          pcVar7 = "unpausing failed: drain problem?\n";
LAB_0010166a:
          curl_mfprintf(_stderr,pcVar7);
          goto LAB_00101476;
        }
LAB_0010152a:
        local_1b8.fds_bits[0xe] = 0;
        local_1b8.fds_bits[0xf] = 0;
        local_1b8.fds_bits[0xc] = 0;
        local_1b8.fds_bits[0xd] = 0;
        local_1b8.fds_bits[10] = 0;
        local_1b8.fds_bits[0xb] = 0;
        local_1b8.fds_bits[8] = 0;
        local_1b8.fds_bits[9] = 0;
        local_1b8.fds_bits[6] = 0;
        local_1b8.fds_bits[7] = 0;
        local_1b8.fds_bits[4] = 0;
        local_1b8.fds_bits[5] = 0;
        local_1b8.fds_bits[2] = 0;
        local_1b8.fds_bits[3] = 0;
        local_1b8.fds_bits[0] = 0;
        local_1b8.fds_bits[1] = 0;
        local_b8.fds_bits[0] = 0;
        local_b8.fds_bits[1] = 0;
        local_b8.fds_bits[2] = 0;
        local_b8.fds_bits[3] = 0;
        local_b8.fds_bits[4] = 0;
        local_b8.fds_bits[5] = 0;
        local_b8.fds_bits[6] = 0;
        local_b8.fds_bits[7] = 0;
        local_b8.fds_bits[8] = 0;
        local_b8.fds_bits[9] = 0;
        local_b8.fds_bits[10] = 0;
        local_b8.fds_bits[0xb] = 0;
        local_b8.fds_bits[0xc] = 0;
        local_b8.fds_bits[0xd] = 0;
        local_b8.fds_bits[0xe] = 0;
        local_b8.fds_bits[0xf] = 0;
        local_138.fds_bits[0] = 0;
        local_138.fds_bits[1] = 0;
        local_138.fds_bits[2] = 0;
        local_138.fds_bits[3] = 0;
        local_138.fds_bits[4] = 0;
        local_138.fds_bits[5] = 0;
        local_138.fds_bits[6] = 0;
        local_138.fds_bits[7] = 0;
        local_138.fds_bits[8] = 0;
        local_138.fds_bits[9] = 0;
        local_138.fds_bits[10] = 0;
        local_138.fds_bits[0xb] = 0;
        local_138.fds_bits[0xc] = 0;
        local_138.fds_bits[0xd] = 0;
        local_138.fds_bits[0xe] = 0;
        local_138.fds_bits[0xf] = 0;
        local_1c8.tv_sec = 0;
        local_1c8.tv_usec = 200000;
        iVar1 = curl_multi_fdset(uVar3,&local_1b8,&local_b8,&local_138,&local_1e8);
        if (iVar1 != 0) goto LAB_00101447;
        iVar1 = select(local_1e8 + 1,&local_1b8,&local_b8,&local_138,&local_1c8);
        if (iVar1 == -1) {
          pcVar7 = "Select error\n";
          goto LAB_0010166a;
        }
        local_1e8 = -1;
        iVar1 = curl_multi_perform();
      } while ((local_1e4 != 0) && (iVar1 == 0));
    }
    if (iVar1 != 0) goto LAB_00101447;
  }
  else {
LAB_00101447:
    piVar5 = (int *)curl_multi_info_read(uVar3,&local_1b8);
    if (piVar5 != (int *)0x0) {
      do {
        if (*piVar5 == 1) {
          iVar2 = piVar5[4];
        }
        piVar5 = (int *)curl_multi_info_read(uVar3,&local_1b8);
      } while (piVar5 != (int *)0x0);
    }
  }
LAB_00101476:
  curl_multi_remove_handle(uVar3,local_1e0);
  curl_multi_cleanup(uVar3);
  iVar1 = iVar2;
LAB_00101396:
  curl_easy_cleanup(local_1e0);
  curl_mime_free(uVar4);
  curl_global_cleanup();
  return iVar1;
}

Assistant:

int test(char *URL)
{
#if defined(LIB670) || defined(LIB671)
  curl_mime *mime = NULL;
  curl_mimepart *part;
#else
  CURLFORMcode formrc;
  struct curl_httppost *formpost = NULL;
  struct curl_httppost *lastptr = NULL;
#endif
#if defined(LIB670) || defined(LIB672)
  CURLM *multi = NULL;
  CURLMcode mres;
  CURLMsg *msg;
  int msgs_left;
  int still_running = 0;
#endif

  struct ReadThis pooh;
  CURLcode result;
  int res = TEST_ERR_FAILURE;

  /*
   * Check proper pausing/unpausing from a mime or form read callback.
   */

  if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  pooh.origin = (time_t) 0;
  pooh.count = 0;
  pooh.easy = curl_easy_init();

  /* First set the URL that is about to receive our POST. */
  test_setopt(pooh.easy, CURLOPT_URL, URL);

  /* get verbose debug output please */
  test_setopt(pooh.easy, CURLOPT_VERBOSE, 1L);

  /* include headers in the output */
  test_setopt(pooh.easy, CURLOPT_HEADER, 1L);

#if defined(LIB670) || defined(LIB671)
  /* Build the mime tree. */
  mime = curl_mime_init(pooh.easy);
  part = curl_mime_addpart(mime);
  result = curl_mime_name(part, name);
  if(!result)
    res = curl_mime_data_cb(part, (curl_off_t) 2, read_callback,
                            NULL, NULL, &pooh);

  if(result) {
    fprintf(stderr,
            "Something went wrong when building the mime structure: %d\n",
            (int) result);
    goto test_cleanup;
  }

  /* Bind mime data to its easy handle. */
  if(!res)
    test_setopt(pooh.easy, CURLOPT_MIMEPOST, mime);
#else
  /* Build the form. */
  formrc = curl_formadd(&formpost, &lastptr,
                        CURLFORM_COPYNAME, name,
                        CURLFORM_STREAM, &pooh,
                        CURLFORM_CONTENTLEN, (curl_off_t) 2,
                        CURLFORM_END);
  if(formrc) {
    fprintf(stderr, "curl_formadd() = %d\n", (int) formrc);
    goto test_cleanup;
  }

  /* We want to use our own read function. */
  test_setopt(pooh.easy, CURLOPT_READFUNCTION, read_callback);

  /* Send a multi-part formpost. */
  test_setopt(pooh.easy, CURLOPT_HTTPPOST, formpost);
#endif

#if defined(LIB670) || defined(LIB672)
  /* Use the multi interface. */
  multi = curl_multi_init();
  mres = curl_multi_add_handle(multi, pooh.easy);
  while(!mres) {
    struct timeval timeout;
    int rc = 0;
    fd_set fdread;
    fd_set fdwrite;
    fd_set fdexcept;
    int maxfd = -1;

    mres = curl_multi_perform(multi, &still_running);
    if(!still_running || mres != CURLM_OK)
      break;

    if(pooh.origin) {
      time_t delta = time(NULL) - pooh.origin;

      if(delta >= 4 * PAUSE_TIME) {
        fprintf(stderr, "unpausing failed: drain problem?\n");
        res = CURLE_OPERATION_TIMEDOUT;
        break;
      }

      if(delta >= PAUSE_TIME)
        curl_easy_pause(pooh.easy, CURLPAUSE_CONT);
    }

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcept);
    timeout.tv_sec = 0;
    timeout.tv_usec = 1000000 * PAUSE_TIME / 10;
    mres = curl_multi_fdset(multi, &fdread, &fdwrite, &fdexcept, &maxfd);
    if(mres)
      break;
#ifdef _WIN32
    if(maxfd == -1)
      Sleep(100);
    else
#endif
    rc = select(maxfd + 1, &fdread, &fdwrite, &fdexcept, &timeout);
    if(rc == -1) {
      fprintf(stderr, "Select error\n");
      break;
    }
  }

  if(mres != CURLM_OK)
    for(;;) {
      msg = curl_multi_info_read(multi, &msgs_left);
      if(!msg)
        break;
      if(msg->msg == CURLMSG_DONE) {
        result = msg->data.result;
        res = (int) result;
      }
    }

  curl_multi_remove_handle(multi, pooh.easy);
  curl_multi_cleanup(multi);

#else
  /* Use the easy interface. */
  test_setopt(pooh.easy, CURLOPT_XFERINFODATA, &pooh);
  test_setopt(pooh.easy, CURLOPT_XFERINFOFUNCTION, xferinfo);
  test_setopt(pooh.easy, CURLOPT_NOPROGRESS, 0L);
  result = curl_easy_perform(pooh.easy);
  res = (int) result;
#endif


test_cleanup:
  curl_easy_cleanup(pooh.easy);
#if defined(LIB670) || defined(LIB671)
  curl_mime_free(mime);
#else
  curl_formfree(formpost);
#endif

  curl_global_cleanup();
  return res;
}